

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

int Gia_ObjCheckTfi_rec(Gia_Man_t *p,Gia_Obj_t *pOld,Gia_Obj_t *pNode,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  if (pNode != (Gia_Obj_t *)0x0) {
    do {
      uVar1 = (uint)*(ulong *)pNode;
      if ((~uVar1 & 0x9fffffff) == 0) {
        return 0;
      }
      if (pNode == pOld) {
        return 1;
      }
      if ((uVar1 >> 0x1e & 1) != 0) {
        return 0;
      }
      *(ulong *)pNode = *(ulong *)pNode | 0x40000000;
      uVar1 = vVisited->nSize;
      if (uVar1 == vVisited->nCap) {
        if ((int)uVar1 < 0x10) {
          if (vVisited->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vVisited->pArray,0x80);
          }
          vVisited->pArray = ppvVar3;
          vVisited->nCap = 0x10;
        }
        else {
          if (vVisited->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
          }
          vVisited->pArray = ppvVar3;
          vVisited->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar3 = vVisited->pArray;
      }
      iVar2 = vVisited->nSize;
      vVisited->nSize = iVar2 + 1;
      ppvVar3[iVar2] = pNode;
      iVar2 = Gia_ObjCheckTfi_rec(p,pOld,pNode + -(ulong)((uint)*(undefined8 *)pNode & 0x1fffffff),
                                  vVisited);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = Gia_ObjCheckTfi_rec(p,pOld,pNode + -(ulong)(*(uint *)&pNode->field_0x4 & 0x1fffffff),
                                  vVisited);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = Gia_ObjId(p,pNode);
      pNode = Gia_ObjNextObj(p,iVar2);
    } while (pNode != (Gia_Obj_t *)0x0);
  }
  return 0;
}

Assistant:

int Gia_ObjCheckTfi_rec( Gia_Man_t * p, Gia_Obj_t * pOld, Gia_Obj_t * pNode, Vec_Ptr_t * vVisited )
{
    // check the trivial cases
    if ( pNode == NULL )
        return 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
//    if ( pNode->Id < pOld->Id ) // cannot use because of choices of pNode
//        return 0;
    if ( pNode == pOld )
        return 1;
    // skip the visited node
    if ( pNode->fMark0 )
        return 0;
    pNode->fMark0 = 1;
    Vec_PtrPush( vVisited, pNode );
    // check the children
    if ( Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjFanin0(pNode), vVisited ) )
        return 1;
    if ( Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjFanin1(pNode), vVisited ) )
        return 1;
    // check equivalent nodes
    return Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjNextObj(p, Gia_ObjId(p, pNode)), vVisited );
}